

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_fe *psVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  secp256k1_strauss_point_state *psVar5;
  uint uVar6;
  secp256k1_gej *bzinv;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint64_t *puVar11;
  secp256k1_ge *psVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  byte bVar19;
  long local_548;
  uint local_540;
  uint local_53c;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  
  bVar19 = 0;
  bzinv = a;
  secp256k1_fe_set_int(&Z,1);
  uVar9 = 0;
  lVar16 = 0;
  do {
    bVar18 = num == 0;
    num = num - 1;
    if (bVar18) {
      if (lVar16 != 0) {
        secp256k1_ge_table_set_globalz(lVar16 * 8,state->pre_a,state->aux);
      }
      lVar8 = 0;
      lVar17 = 0;
      for (lVar14 = 0; lVar14 != lVar16; lVar14 = lVar14 + 1) {
        lVar15 = lVar8;
        for (lVar10 = 0; lVar10 != 0x180; lVar10 = lVar10 + 0x30) {
          secp256k1_fe_mul((secp256k1_fe *)((long)state->aux->n + lVar10 + lVar17),
                           (secp256k1_fe *)((long)(state->pre_a->x).n + lVar15),
                           &secp256k1_const_beta);
          lVar15 = lVar15 + 0x68;
        }
        lVar17 = lVar17 + 0x180;
        lVar8 = lVar8 + 0x340;
      }
      if (ng == (secp256k1_scalar *)0x0) {
        local_53c = 0;
        local_540 = 0;
      }
      else {
        secp256k1_scalar_split_128(&ng_1,&ng_128,ng);
        local_53c = secp256k1_ecmult_wnaf(wnaf_ng_1,0x81,&ng_1,0xf);
        bzinv = (secp256k1_gej *)0xf;
        local_540 = secp256k1_ecmult_wnaf(wnaf_ng_128,0x81,&ng_128,0xf);
        if ((int)uVar9 < (int)local_53c) {
          uVar9 = local_53c;
        }
        if ((int)uVar9 < (int)local_540) {
          uVar9 = local_540;
        }
      }
      secp256k1_gej_set_infinity(r);
      uVar4 = (ulong)uVar9;
      local_548 = uVar4 * 4;
      while (iVar2 = (int)uVar4, 0 < iVar2) {
        uVar4 = uVar4 - 1;
        secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
        lVar17 = 0x40c;
        lVar15 = 0;
        lVar8 = 0x30;
        lVar14 = lVar16;
        while (bVar18 = lVar14 != 0, lVar14 = lVar14 + -1, bVar18) {
          psVar5 = state->ps;
          if (iVar2 <= *(int *)((long)psVar5->wnaf_na_1 + lVar17 + -4)) {
            bzinv = (secp256k1_gej *)((long)psVar5->wnaf_na_1 + local_548);
            uVar9 = *(uint *)(lVar17 + -0x410 + (long)bzinv);
            if (uVar9 != 0) {
              psVar12 = state->pre_a;
              secp256k1_ecmult_table_verify(uVar9,5);
              if ((int)uVar9 < 1) {
                puVar11 = (uint64_t *)((long)(&psVar12[~uVar9 >> 1].x + -1) + lVar8);
                psVar12 = &tmpa;
                for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (psVar12->x).n[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
                  psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar19 * -0x10 + 8);
                }
                secp256k1_fe_negate_unchecked(&tmpa.y,&tmpa.y,1);
              }
              else {
                puVar11 = (uint64_t *)((long)(&psVar12[uVar9 - 1 >> 1].x + -1) + lVar8);
                psVar12 = &tmpa;
                for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (psVar12->x).n[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
                  psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar19 * -0x10 + 8);
                }
              }
              bzinv = (secp256k1_gej *)0x0;
              secp256k1_gej_add_ge_var(r,r,&tmpa,(secp256k1_fe *)0x0);
              psVar5 = state->ps;
            }
          }
          if ((iVar2 <= *(int *)((long)psVar5->wnaf_na_1 + lVar17)) &&
             (uVar9 = *(uint *)((long)psVar5 + lVar17 + -0x20c + local_548), uVar9 != 0)) {
            psVar1 = state->aux;
            psVar12 = state->pre_a;
            secp256k1_ecmult_table_verify(uVar9,5);
            if ((int)uVar9 < 1) {
              secp256k1_ge_set_xy(&tmpa,(secp256k1_fe *)((long)psVar1[~uVar9 >> 1].n + lVar15),
                                  (secp256k1_fe *)((long)psVar12[~uVar9 >> 1].x.n + lVar8));
              secp256k1_fe_negate_unchecked(&tmpa.y,&tmpa.y,1);
            }
            else {
              uVar9 = uVar9 - 1 >> 1;
              secp256k1_ge_set_xy(&tmpa,(secp256k1_fe *)((long)psVar1[uVar9].n + lVar15),
                                  (secp256k1_fe *)((long)psVar12[uVar9].x.n + lVar8));
            }
            bzinv = (secp256k1_gej *)0x0;
            secp256k1_gej_add_ge_var(r,r,&tmpa,(secp256k1_fe *)0x0);
          }
          lVar8 = lVar8 + 0x340;
          lVar15 = lVar15 + 0x180;
          lVar17 = lVar17 + 0x410;
        }
        if ((iVar2 <= (int)local_53c) && (wnaf_ng_1[uVar4] != 0)) {
          secp256k1_ecmult_table_get_ge_storage(&tmpa,secp256k1_pre_g,wnaf_ng_1[uVar4],(int)bzinv);
          bzinv = (secp256k1_gej *)&Z;
          secp256k1_gej_add_zinv_var(r,r,&tmpa,(secp256k1_fe *)bzinv);
        }
        if ((iVar2 <= (int)local_540) && (wnaf_ng_128[uVar4] != 0)) {
          secp256k1_ecmult_table_get_ge_storage
                    (&tmpa,secp256k1_pre_g_128,wnaf_ng_128[uVar4],(int)bzinv);
          bzinv = (secp256k1_gej *)&Z;
          secp256k1_gej_add_zinv_var(r,r,&tmpa,(secp256k1_fe *)bzinv);
        }
        local_548 = local_548 + -4;
      }
      if (r->infinity == 0) {
        secp256k1_fe_mul(&r->z,&r->z,&Z);
      }
      return;
    }
    iVar2 = secp256k1_scalar_is_zero(na);
    if ((iVar2 == 0) && (iVar2 = secp256k1_gej_is_infinity(a), iVar2 == 0)) {
      secp256k1_scalar_split_lambda((secp256k1_scalar *)wnaf_ng_128,(secp256k1_scalar *)&tmpa,na);
      iVar2 = secp256k1_ecmult_wnaf
                        (state->ps[lVar16].wnaf_na_1,0x81,(secp256k1_scalar *)wnaf_ng_128,5);
      psVar5 = state->ps;
      psVar5[lVar16].bits_na_1 = iVar2;
      uVar3 = secp256k1_ecmult_wnaf(psVar5[lVar16].wnaf_na_lam,0x81,(secp256k1_scalar *)&tmpa,5);
      psVar5 = state->ps;
      psVar5[lVar16].bits_na_lam = uVar3;
      uVar6 = psVar5[lVar16].bits_na_1;
      if (0x81 < (int)uVar6) {
        pcVar13 = "test condition failed: state->ps[no].bits_na_1 <= 129";
        uVar7 = 0x108;
LAB_0012fcbc:
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
                ,uVar7,pcVar13);
        abort();
      }
      if (0x81 < (int)uVar3) {
        pcVar13 = "test condition failed: state->ps[no].bits_na_lam <= 129";
        uVar7 = 0x109;
        goto LAB_0012fcbc;
      }
      if ((int)uVar6 <= (int)uVar9) {
        uVar6 = uVar9;
      }
      uVar9 = uVar6;
      if ((int)uVar6 < (int)uVar3) {
        uVar9 = uVar3;
      }
      memcpy((secp256k1_gej *)wnaf_ng_1,a,0x98);
      bzinv = (secp256k1_gej *)&Z;
      if (lVar16 != 0) {
        secp256k1_gej_rescale((secp256k1_gej *)wnaf_ng_1,(secp256k1_fe *)bzinv);
      }
      secp256k1_ecmult_odd_multiples_table
                (8,state->pre_a + lVar16 * 8,state->aux + lVar16 * 8,(secp256k1_fe *)bzinv,
                 (secp256k1_gej *)wnaf_ng_1);
      if (lVar16 != 0) {
        secp256k1_fe_mul(state->aux + lVar16 * 8,state->aux + lVar16 * 8,&a->z);
      }
      lVar16 = lVar16 + 1;
    }
    na = na + 1;
    a = a + 1;
  } while( true );
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}